

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorTables::~FileDescriptorTables(FileDescriptorTables *this)

{
  __pointer_type pfVar1;
  FileDescriptorTables *this_local;
  
  pfVar1 = std::
           atomic<const_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>_*>
           ::load(&this->fields_by_lowercase_name_,memory_order_acquire);
  if (pfVar1 != (__pointer_type)0x0) {
    absl::lts_20250127::
    flat_hash_map<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
    ::~flat_hash_map(pfVar1);
    operator_delete(pfVar1,0x20);
  }
  pfVar1 = std::
           atomic<const_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>_*>
           ::load(&this->fields_by_camelcase_name_,memory_order_acquire);
  if (pfVar1 != (__pointer_type)0x0) {
    absl::lts_20250127::
    flat_hash_map<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
    ::~flat_hash_map(pfVar1);
    operator_delete(pfVar1,0x20);
  }
  absl::lts_20250127::Mutex::Dtor(&this->unknown_enum_values_mu_);
  absl::lts_20250127::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
  ::~flat_hash_map(&this->locations_by_path_);
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::~flat_hash_set(&this->unknown_enum_values_by_number_);
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::~flat_hash_set(&this->enum_values_by_number_);
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~flat_hash_set(&this->fields_by_number_);
  absl::lts_20250127::
  flat_hash_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::~flat_hash_set(&this->symbols_by_parent_);
  return;
}

Assistant:

FileDescriptorTables::~FileDescriptorTables() {
  delete fields_by_lowercase_name_.load(std::memory_order_acquire);
  delete fields_by_camelcase_name_.load(std::memory_order_acquire);
}